

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

void duckdb_lz4::LZ4_resetStream_fast(LZ4_stream_t *ctx)

{
  uint uVar1;
  
  if ((ctx->internal_donotuse).tableType == 2) {
    uVar1 = (ctx->internal_donotuse).currentOffset;
    if (0x40000000 < uVar1) goto LAB_01bd8c0b;
  }
  else {
    if ((ctx->internal_donotuse).tableType != 0) {
LAB_01bd8c0b:
      switchD_010444a0::default(ctx,0,0x4000);
      *(char *)((long)ctx + 0x4010) = '\0';
      *(char *)((long)ctx + 0x4011) = '\0';
      *(char *)((long)ctx + 0x4012) = '\0';
      *(char *)((long)ctx + 0x4013) = '\0';
      *(char *)((long)ctx + 0x4014) = '\0';
      *(char *)((long)ctx + 0x4015) = '\0';
      *(char *)((long)ctx + 0x4016) = '\0';
      *(char *)((long)ctx + 0x4017) = '\0';
      goto LAB_01bd8c36;
    }
    uVar1 = (ctx->internal_donotuse).currentOffset;
  }
  if (uVar1 != 0) {
    (ctx->internal_donotuse).currentOffset = uVar1 + 0x10000;
  }
LAB_01bd8c36:
  (ctx->internal_donotuse).dictSize = 0;
  (ctx->internal_donotuse).dictionary = (LZ4_byte *)0x0;
  (ctx->internal_donotuse).dictCtx = (LZ4_stream_t_internal *)0x0;
  return;
}

Assistant:

void LZ4_resetStream_fast(LZ4_stream_t* ctx) {
    LZ4_prepareTable(&(ctx->internal_donotuse), 0, byU32);
}